

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t nghttp2_hd_inflate_hd2
                  (nghttp2_hd_inflater *inflater,nghttp2_nv *nv_out,int *inflate_flags,uint8_t *in,
                  size_t inlen,int in_final)

{
  ssize_t sVar1;
  undefined1 local_60 [8];
  nghttp2_hd_nv hd_nv;
  ssize_t rv;
  int in_final_local;
  size_t inlen_local;
  uint8_t *in_local;
  int *inflate_flags_local;
  nghttp2_nv *nv_out_local;
  nghttp2_hd_inflater *inflater_local;
  
  sVar1 = nghttp2_hd_inflate_hd_nv
                    (inflater,(nghttp2_hd_nv *)local_60,inflate_flags,in,inlen,in_final);
  if ((-1 < sVar1) && ((*inflate_flags & 2U) != 0)) {
    nv_out->name = *(uint8_t **)((long)local_60 + 0x10);
    nv_out->namelen = *(size_t *)((long)local_60 + 0x18);
    nv_out->value = (hd_nv.name)->base;
    nv_out->valuelen = (hd_nv.name)->len;
    nv_out->flags = hd_nv.value._4_1_;
  }
  return sVar1;
}

Assistant:

ssize_t nghttp2_hd_inflate_hd2(nghttp2_hd_inflater *inflater,
                               nghttp2_nv *nv_out, int *inflate_flags,
                               const uint8_t *in, size_t inlen, int in_final) {
  ssize_t rv;
  nghttp2_hd_nv hd_nv;

  rv = nghttp2_hd_inflate_hd_nv(inflater, &hd_nv, inflate_flags, in, inlen,
                                in_final);

  if (rv < 0) {
    return rv;
  }

  if (*inflate_flags & NGHTTP2_HD_INFLATE_EMIT) {
    nv_out->name = hd_nv.name->base;
    nv_out->namelen = hd_nv.name->len;

    nv_out->value = hd_nv.value->base;
    nv_out->valuelen = hd_nv.value->len;

    nv_out->flags = hd_nv.flags;
  }

  return rv;
}